

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

void __thiscall rw::World::enumerateLights(World *this,Atomic *atomic,WorldLights *lightData)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  LLLink *pLVar6;
  Sphere *pSVar7;
  Matrix *pMVar8;
  LLLink *pLVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  iVar2 = lightData->numDirectionals;
  iVar3 = lightData->numLocals;
  lightData->numLocals = 0;
  lightData->numAmbients = 0;
  (lightData->ambient).red = 0.0;
  (lightData->ambient).green = 0.0;
  (lightData->ambient).blue = 0.0;
  *(undefined8 *)&(lightData->ambient).alpha = 0x3f800000;
  uVar4 = atomic->geometry->flags;
  pLVar6 = (this->globalLights).link.next;
  while (pLVar9 = pLVar6, pLVar9 != &(this->globalLights).link) {
    pLVar6 = pLVar9->next;
    if (((ulong)pLVar9[-4].next & 0x10000) != 0) {
      cVar1 = *(char *)((long)&pLVar9[-4].next + 1);
      if (cVar1 == '\x02') {
        (lightData->ambient).red =
             (float32)(*(float *)((long)&pLVar9[-2].prev + 4) + (float)(lightData->ambient).red);
        (lightData->ambient).green =
             (float32)(*(float *)&pLVar9[-1].next + (float)(lightData->ambient).green);
        (lightData->ambient).blue =
             (float32)(*(float *)((long)&pLVar9[-1].next + 4) + (float)(lightData->ambient).blue);
        lightData->numAmbients = lightData->numAmbients + 1;
      }
      else if (((uVar4 & 0x10) != 0) && (cVar1 == '\x01')) {
        iVar5 = lightData->numDirectionals;
        if (iVar5 < iVar2) {
          lightData->numDirectionals = iVar5 + 1;
          lightData->directionals[iVar5] = (Light *)(pLVar9 + -4);
        }
      }
    }
  }
  if ((atomic->world == this) && ((uVar4 & 0x10) != 0)) {
    pLVar6 = (this->localLights).link.next;
    while ((pLVar9 = pLVar6, pLVar9 != &(this->localLights).link && (lightData->numLocals < iVar3)))
    {
      pLVar6 = pLVar9->next;
      if (((ulong)pLVar9[-4].next & 0x10000) != 0) {
        pSVar7 = Atomic::getWorldBoundingSphere(atomic);
        pMVar8 = Frame::getLTM((Frame *)pLVar9[-4].prev);
        fVar11 = (float)(pMVar8->pos).x - (float)(pSVar7->center).x;
        fVar12 = (float)(pMVar8->pos).y - (float)(pSVar7->center).y;
        fVar10 = (float)(pMVar8->pos).z - (float)(pSVar7->center).z;
        fVar10 = fVar10 * fVar10 + fVar11 * fVar11 + fVar12 * fVar12;
        if (fVar10 < 0.0) {
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        if (fVar10 < (float)pSVar7->radius + *(float *)&pLVar9[-2].prev) {
          iVar2 = lightData->numLocals;
          lightData->numLocals = iVar2 + 1;
          lightData->locals[iVar2] = (Light *)(pLVar9 + -4);
        }
      }
    }
  }
  return;
}

Assistant:

void
World::enumerateLights(Atomic *atomic, WorldLights *lightData)
{
	int32 maxDirectionals, maxLocals;

	maxDirectionals = lightData->numDirectionals;
	maxLocals = lightData->numLocals;

	lightData->numDirectionals = 0;
	lightData->numLocals = 0;
	lightData->numAmbients = 0;
	lightData->ambient.red = 0.0f;
	lightData->ambient.green = 0.0f;
	lightData->ambient.blue = 0.0f;
	lightData->ambient.alpha = 1.0f;

	bool32 normals = atomic->geometry->flags & Geometry::NORMALS;

	FORLIST(lnk, this->globalLights){
		Light *l = Light::fromWorld(lnk);
		if((l->getFlags() & Light::LIGHTATOMICS) == 0)
			continue;
		if(l->getType() == Light::AMBIENT){
			lightData->ambient.red   += l->color.red;
			lightData->ambient.green += l->color.green;
			lightData->ambient.blue  += l->color.blue;
			lightData->numAmbients++;
		}else if(normals && l->getType() == Light::DIRECTIONAL){
			if(lightData->numDirectionals < maxDirectionals)
				lightData->directionals[lightData->numDirectionals++] = l;
		}
	}

	if(atomic->world != this)
		return;

	if(!normals)
		return;

	// TODO: for this we would use an atomic's world sectors, but we don't have those yet
	FORLIST(lnk, this->localLights){
		if(lightData->numLocals >= maxLocals)
			return;

		Light *l = Light::fromWorld(lnk);
		if((l->getFlags() & Light::LIGHTATOMICS) == 0)
			continue;

		// check if spheres are intersecting
		Sphere *atomsphere = atomic->getWorldBoundingSphere();
		V3d dist = sub(l->getFrame()->getLTM()->pos, atomsphere->center);
		if(length(dist) < atomsphere->radius + l->radius)
			lightData->locals[lightData->numLocals++] = l;
	}
}